

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  pointer pcVar2;
  bool bVar3;
  IColourImpl *pIVar4;
  pointer pbVar5;
  Colour colourGuard;
  Colour local_c1;
  string local_c0;
  Text local_a0;
  TextAttributes local_48;
  
  bVar3 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,"with expansion:\n",0x10);
    local_c1.m_moved = false;
    pIVar4 = Colour::impl();
    (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,6);
    poVar1 = this->stream;
    pcVar2 = (this->result->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar2,
               pcVar2 + (this->result->m_resultData).reconstructedExpression._M_string_length);
    local_48.initialIndent = 0xffffffffffffffff;
    local_48.width = 0x4f;
    local_48.tabChar = '\t';
    local_48.indent = 2;
    Tbc::Text::Text(&local_a0,&local_c0,&local_48);
    for (pbVar5 = local_a0.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != local_a0.lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      if (pbVar5 != local_a0.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0.lines);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.str._M_dataplus._M_p != &local_a0.str.field_2) {
      operator_delete(local_a0.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    Colour::~Colour(&local_c1);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }